

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O2

void __thiscall
RigidBodyDynamics::LoopConstraint::calcPositionError
          (LoopConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *errSysUpd,
          ConstraintCache *cache,bool updateKinematics)

{
  ConstraintCache *dst;
  undefined1 auVar1 [16];
  Scalar SVar2;
  double dVar3;
  uint i;
  ulong __n;
  long lVar4;
  reference rVar5;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  local_98;
  Matrix3d local_78;
  
  CalcBodyToBaseCoordinates
            ((Vector3d *)&local_78,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             &((this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  dst = cache + 0x470;
  *(double *)(cache + 0x4c8) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  *(double *)(cache + 0x4b8) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  *(double *)(cache + 0x4c0) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  CalcBodyWorldOrientation
            (&local_78,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,updateKinematics);
  local_98.m_rhs.m_lhs =
       (LhsNested)
       (this->super_Constraint).bodyFrames.
       super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
       .
       super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98.m_lhs.m_matrix = &local_78.super_Matrix3d;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)dst,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
              *)&local_98);
  CalcBodyToBaseCoordinates
            ((Vector3d *)&local_78,model,Q,
             (this->super_Constraint).bodyIds.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],
             &(this->super_Constraint).bodyFrames.
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              .
              super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ._M_impl.super__Vector_impl_data._M_start[1].r,updateKinematics);
  *(double *)(cache + 0x528) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  *(double *)(cache + 0x518) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  *(double *)(cache + 0x520) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  CalcBodyWorldOrientation
            (&local_78,model,Q,
             (this->super_Constraint).bodyIds.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],updateKinematics);
  local_98.m_rhs.m_lhs =
       (LhsNested)
       ((this->super_Constraint).bodyFrames.
        super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        .
        super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ._M_impl.super__Vector_impl_data._M_start + 1);
  local_98.m_lhs.m_matrix = &local_78.super_Matrix3d;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)(cache + 0x4d0),
             (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
              *)&local_98);
  local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = (double)dst;
  local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = (double)(cache + 0x4d0);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)(cache + 0xe0),
             (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
              *)&local_78);
  dVar3 = (*(double *)(cache + 0xf0) - *(double *)(cache + 0x110)) * -0.5;
  auVar1._8_4_ = SUB84(dVar3,0);
  auVar1._0_8_ = (*(double *)(cache + 0x118) - *(double *)(cache + 0x108)) * -0.5;
  auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
  *(undefined1 (*) [16])(cache + 0x350) = auVar1;
  *(double *)(cache + 0x360) = (*(double *)(cache + 0xf8) - *(double *)(cache + 0xe8)) * -0.5;
  local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = (double)(cache + 0x368);
  local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = 1.48219693752374e-323;
  local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[2] = 4.94065645841247e-324;
  local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[4] = 1.48219693752374e-323;
  local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[5] = 0.0;
  local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[6] = 2.96439387504748e-323;
  local_98.m_lhs.m_matrix = (non_const_type)dst;
  local_98.m_rhs.m_lhs = (LhsNested)(cache + 0x518);
  local_98.m_rhs.m_rhs = (RhsNested)(cache + 0x4b8);
  local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] = (double)(cache + 0x350);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,_1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
            ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false> *)&local_78,&local_98);
  lVar4 = 0;
  for (__n = 0; __n < (this->super_Constraint).sizeOfConstraint; __n = __n + 1) {
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&(this->super_Constraint).positionConstraint,__n);
    if ((*rVar5._M_p & rVar5._M_mask) == 0) {
      (errSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [(this->super_Constraint).rowInSystem + (int)__n] = 0.0;
    }
    else {
      local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
      .m_data.array[0] = (double)(*(long *)&(this->super_Constraint).field_0xd8 + lVar4);
      local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
      .m_data.array[1] = (double)(cache + 0x350);
      SVar2 = Eigen::internal::dense_product_base::operator_cast_to_double
                        ((dense_product_base *)&local_78);
      (errSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [(this->super_Constraint).rowInSystem + (int)__n] = SVar2;
    }
    lVar4 = lVar4 + 0x30;
  }
  return;
}

Assistant:

void LoopConstraint::calcPositionError(Model &model,
                                      const double time,
                                      const Math::VectorNd &Q,
                                      Math::VectorNd &errSysUpd,
                                      ConstraintCache &cache,
                                      bool updateKinematics)
{

  // Constraints computed in the predecessor body frame.


  // Compute the position of the two contact points.

  //Kp: predecessor frame
  cache.stA.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                          updateKinematics);
  cache.stA.E = CalcBodyWorldOrientation(model,Q,bodyIds[0],updateKinematics
                                         ).transpose()*bodyFrames[0].E;

  //Ks: successor frame
  cache.stB.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[1],bodyFrames[1].r,
                                          updateKinematics);
  cache.stB.E = CalcBodyWorldOrientation(model,Q,bodyIds[1],updateKinematics
                                         ).transpose()*bodyFrames[1].E;


  // Compute the orientation from the predecessor to the successor frame.

  cache.mat3A = cache.stA.E.transpose()*cache.stB.E;

  // The first three elements represent the rotation error.
  // This formulation is equivalent to u * sin(theta), where u and theta are
  // the angle-axis of rotation from the predecessor to the successor frame.
  // These quantities are expressed in the predecessor frame. This is also
  // similar to the rotation error calculation that appears in Table 8.1 of
  // Featherstone.
  cache.svecA[0] = -0.5*(cache.mat3A(1,2)-cache.mat3A(2,1));
  cache.svecA[1] = -0.5*(cache.mat3A(2,0)-cache.mat3A(0,2));
  cache.svecA[2] = -0.5*(cache.mat3A(0,1)-cache.mat3A(1,0));

  // The last three elements represent the position error.
  // It is equivalent to the difference in the position of the two
  // constraint points. The distance is projected on the predecessor frame
  // to be consistent with the rotation.

  //Qn: Should this be multiplied by -0.5 to be consistent with table 8.1?
  //For now I'm leaving this as is: this is equivalent to the functioning
  //original loop constraint code.
  cache.svecA.block(3,0,3,1)=cache.stA.E.transpose()*(cache.stB.r-cache.stA.r);

  for(unsigned int i=0; i<sizeOfConstraint;++i){
    if(positionConstraint[i]){
      errSysUpd[rowInSystem+i] = T[i].transpose()*cache.svecA;
    }else{
      errSysUpd[rowInSystem+i] = 0.;
    }
  }

}